

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall
QPDF::addPageAt(QPDF *this,QPDFObjectHandle *newpage,bool before,QPDFObjectHandle *refpage)

{
  QPDFObjectHandle local_40;
  int local_2c;
  QPDFObjectHandle *pQStack_28;
  int refpos;
  QPDFObjectHandle *refpage_local;
  QPDFObjectHandle *pQStack_18;
  bool before_local;
  QPDFObjectHandle *newpage_local;
  QPDF *this_local;
  
  pQStack_28 = refpage;
  refpage_local._7_1_ = before;
  pQStack_18 = newpage;
  newpage_local = (QPDFObjectHandle *)this;
  local_2c = findPage(this,refpage);
  if ((refpage_local._7_1_ & 1) == 0) {
    local_2c = local_2c + 1;
  }
  QPDFObjectHandle::QPDFObjectHandle(&local_40,newpage);
  insertPage(this,&local_40,local_2c);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  return;
}

Assistant:

void
QPDF::addPageAt(QPDFObjectHandle newpage, bool before, QPDFObjectHandle refpage)
{
    int refpos = findPage(refpage);
    if (!before) {
        ++refpos;
    }
    insertPage(newpage, refpos);
}